

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

void mi_option_set_enabled(mi_option_t option,_Bool enable)

{
  undefined7 in_register_00000031;
  
  mi_option_set(option,CONCAT71(in_register_00000031,enable) & 0xffffffff);
  return;
}

Assistant:

void mi_option_set_enabled(mi_option_t option, bool enable) {
  mi_option_set(option, (enable ? 1 : 0));
}